

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::
UtilsTest_HexEncodingDecoding_DecodingHexStringWithInvalidCharactersShouldFail_Test::TestBody
          (UtilsTest_HexEncodingDecoding_DecodingHexStringWithInvalidCharactersShouldFail_Test *this
          )

{
  char *message;
  ByteArray buf;
  internal local_90 [8];
  undefined8 *local_88;
  string local_80;
  ErrorCode local_5c;
  ByteArray local_58;
  Error local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"00010g","");
  utils::Hex(&local_38,&local_58,&local_80);
  local_5c = kInvalidArgs;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            (local_90,"utils::Hex(buf, \"00010g\")","ErrorCode::kInvalidArgs",&local_38,&local_5c);
  if (local_38.mMessage._M_dataplus._M_p != (pointer)((long)&local_38 + 0x18U)) {
    operator_delete(local_38.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_88 == (undefined8 *)0x0) {
      message = anon_var_dwarf_4278be + 9;
    }
    else {
      message = (char *)*local_88;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x76,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_38._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_38._0_8_ + 8))();
    }
  }
  if (local_88 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_88 != local_88 + 2) {
      operator_delete((undefined8 *)*local_88);
    }
    operator_delete(local_88);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(UtilsTest, HexEncodingDecoding_EmptyStringDecodedIntoEmptyByteArray)
{
    ByteArray   buf;
    std::string hexStr;

    EXPECT_EQ(utils::Hex(buf, hexStr), ErrorCode::kNone);
    EXPECT_TRUE(buf.empty());
}